

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O1

void __thiscall asl::WebSocketServer::serve(WebSocketServer *this,Socket *client)

{
  anon_union_16_2_78e7fdac_for_String_2 *paVar1;
  char b;
  int iVar2;
  int iVar3;
  String *pSVar4;
  undefined8 uVar5;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  long lVar7;
  bool bVar8;
  String name;
  Dic<asl::String> headers;
  String value;
  String cname;
  String line;
  String head;
  String res;
  String method;
  String local_f0;
  Array<asl::Map<asl::String,_asl::String>::KeyVal> local_d8;
  String local_d0;
  String local_b8;
  Socket *local_a0;
  String local_98;
  String local_80;
  WebSocketServer *local_68;
  String local_60;
  String local_48;
  
  local_a0 = client;
  local_68 = this;
  Socket_::readLine(&local_80,(Socket_ *)(client->super_SmartObject)._p);
  iVar2 = String::indexOf(&local_80,' ',0);
  if (iVar2 != -1) {
    iVar3 = String::indexOf(&local_80,' ',iVar2 + 1);
    if (iVar3 != -1) {
      String::substring(&local_48,&local_80,0,iVar2);
      String::substring(&local_60,&local_80,iVar2 + 1,iVar3);
      local_98.field_2._space[0] = '\0';
      local_98._size = 0;
      local_98._len = 0;
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::alloc(&local_d8,0);
      paVar1 = &local_f0.field_2;
      do {
        Socket_::readLine(&local_f0,(Socket_ *)(local_a0->super_SmartObject)._p);
        uVar5 = &local_f0.field_2;
        if (local_f0._size != 0) {
          uVar5 = local_f0.field_2._str;
        }
        String::assign(&local_98,(char *)uVar5,local_f0._len);
        paVar6 = &local_98.field_2;
        if (local_98._size != 0) {
          paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                   CONCAT71(local_98.field_2._1_7_,local_98.field_2._space[0]);
        }
        iVar2 = strcmp(paVar6->_space,"\r");
        if (local_f0._size != 0) {
          free(local_f0.field_2._str);
        }
        if (iVar2 == 0) {
          String::String(&local_b8,"\n");
          String::String(&local_d0,": ");
          Map<asl::String,_asl::String>::join
                    (&local_f0,(Map<asl::String,_asl::String> *)&local_d8,&local_b8,&local_d0);
          if (local_f0._size != 0) {
            free(local_f0.field_2._str);
          }
          if (local_d0._size != 0) {
            free((void *)CONCAT71(local_d0.field_2._1_7_,local_d0.field_2._space[0]));
          }
          if (local_b8._size != 0) {
            free((void *)CONCAT71(local_b8.field_2._1_7_,local_b8.field_2._space[0]));
          }
          process(local_68,local_a0,(Dic<asl::String> *)&local_d8);
          break;
        }
        pSVar4 = String::trim(&local_98);
        if (pSVar4->_size == 0) {
          paVar6 = &pSVar4->field_2;
        }
        else {
          paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar4->field_2)._str;
        }
        String::assign(&local_98,paVar6->_space,pSVar4->_len);
        iVar2 = String::indexOf(&local_98,':',0);
        if (iVar2 < 0) {
          (*((local_a0->super_SmartObject)._p)->_vptr_SmartObject_[0xb])();
        }
        else {
          String::substring(&local_f0,&local_98,0,iVar2);
          local_b8.field_2._space[0] = '\0';
          local_b8._size = 0;
          local_b8._len = 0;
          if (0 < local_f0._len) {
            bVar8 = true;
            lVar7 = 0;
            do {
              if (bVar8) {
                uVar5 = paVar1;
                if (local_f0._size != 0) {
                  uVar5 = local_f0.field_2._str;
                }
                iVar3 = toupper((int)*(char *)(uVar5 + lVar7));
                b = (char)iVar3;
              }
              else {
                uVar5 = paVar1;
                if (local_f0._size != 0) {
                  uVar5 = local_f0.field_2._str;
                }
                iVar3 = tolower((int)*(char *)(uVar5 + lVar7));
                b = (char)iVar3;
              }
              String::operator+=(&local_b8,b);
              uVar5 = paVar1;
              if (local_f0._size != 0) {
                uVar5 = local_f0.field_2._str;
              }
              iVar3 = isalnum((int)*(char *)(uVar5 + lVar7));
              bVar8 = iVar3 == 0;
              lVar7 = lVar7 + 1;
            } while (lVar7 < local_f0._len);
          }
          if (iVar2 < local_98._len + -1) {
            String::substring(&local_d0,&local_98,iVar2 + 2,local_98._len);
          }
          else {
            local_d0.field_2._space[0] = '\0';
            local_d0._size = 0;
            local_d0._len = 0;
          }
          pSVar4 = Map<asl::String,_asl::String>::operator[]
                             ((Map<asl::String,_asl::String> *)&local_d8,&local_b8);
          paVar6 = &local_d0.field_2;
          if (local_d0._size != 0) {
            paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                     CONCAT71(local_d0.field_2._1_7_,local_d0.field_2._space[0]);
          }
          String::assign(pSVar4,paVar6->_space,local_d0._len);
          if (local_d0._size != 0) {
            free((void *)CONCAT71(local_d0.field_2._1_7_,local_d0.field_2._space[0]));
          }
          if (local_b8._size != 0) {
            free((void *)CONCAT71(local_b8.field_2._1_7_,local_b8.field_2._space[0]));
          }
          if (local_f0._size != 0) {
            free(local_f0.field_2._str);
          }
        }
      } while (-1 < iVar2);
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array(&local_d8);
      if (local_98._size != 0) {
        free((void *)CONCAT71(local_98.field_2._1_7_,local_98.field_2._space[0]));
      }
      if (local_60._size != 0) {
        free(local_60.field_2._str);
      }
      if (local_48._size != 0) {
        free(local_48.field_2._str);
      }
    }
  }
  if (local_80._size != 0) {
    free(local_80.field_2._str);
  }
  return;
}

Assistant:

void WebSocketServer::serve(Socket client)
{
	String head = client.readLine();
	int i = head.indexOf(' ');
	if (i == -1)
		return;
	int j = head.indexOf(' ', i + 1);
	if (j == -1)
		return;
	String method = head.substring(0, i);
	String res = head.substring(i + 1, j);

	String line;
	Dic<String> headers;
	while (line = client.readLine(), line != "\r")
	{
		line = line.trim();
		int c = line.indexOf(':');
		if (c < 0) {
			client.close();
			return;
		}
		String name = line.substring(0, c);
		String cname;
		bool capitalize = true;
		for (int k = 0; k < name.length(); k++)
		{
			cname << char(capitalize ? toupper(name[k]) : tolower(name[k]));
			capitalize = !isalnum(name[k]);
		}

		String value = (c < line.length() - 1) ? line.substring(c + 2) : String();
		headers[cname] = value;
	}

	DEBUG_LOG("%s\n\n\n", *headers.join("\n", ": "));

	process(client, headers);
}